

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::NetworkAddressHttpClient>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::NetworkAddressHttpClient> *this,void *pointer)

{
  AvailableClient *__last;
  undefined8 *puVar1;
  AvailableClient *__last_00;
  AvailableClient *pAVar2;
  undefined8 *puVar3;
  allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient> *in_RDX;
  allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient> *extraout_RDX;
  allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient> *extraout_RDX_00;
  _Map_pointer __nfinish;
  undefined8 *puVar4;
  AvailableClient *__first;
  
  if (pointer != (void *)0x0) {
    __first = *(AvailableClient **)((long)pointer + 0x88);
    __last = *(AvailableClient **)((long)pointer + 0x98);
    puVar1 = *(undefined8 **)((long)pointer + 0xa0);
    __last_00 = *(AvailableClient **)((long)pointer + 0xa8);
    pAVar2 = *(AvailableClient **)((long)pointer + 0xb0);
    puVar3 = *(undefined8 **)((long)pointer + 0xc0);
    puVar4 = puVar1;
    while (puVar4 = puVar4 + 1, puVar4 < puVar3) {
      std::
      _Destroy<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient*,kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>
                ((AvailableClient *)*puVar4,(AvailableClient *)*puVar4 + 0x15,in_RDX);
      in_RDX = extraout_RDX;
    }
    if (puVar1 != puVar3) {
      std::
      _Destroy<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient*,kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>
                (__first,__last,in_RDX);
      in_RDX = extraout_RDX_00;
      __first = pAVar2;
    }
    std::
    _Destroy<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient*,kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>
              (__first,__last_00,in_RDX);
    if (*(long *)((long)pointer + 0x78) != 0) {
      std::
      _Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ::_M_destroy_nodes(*(_Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                           **)((long)pointer + 0xa0),
                         (_Map_pointer)(*(long *)((long)pointer + 0xc0) + 8),__nfinish);
      operator_delete(*(void **)((long)pointer + 0x78),*(long *)((long)pointer + 0x80) << 3);
    }
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)pointer + 0x70));
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)((long)pointer + 0x58));
    Own<kj::NetworkAddress,_std::nullptr_t>::dispose
              ((Own<kj::NetworkAddress,_std::nullptr_t> *)((long)pointer + 0x18));
  }
  operator_delete(pointer,200);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }